

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O2

_Bool rtosc_match(char *pattern,char *msg,char **path_end)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  bool bVar6;
  
  pcVar2 = rtosc_match_path(pattern,msg,path_end);
  if (pcVar2 == (char *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = true;
    if (*pcVar2 == ':') {
      do {
        pcVar3 = rtosc_argument_string(msg);
        cVar4 = pcVar2[1];
        bVar6 = true;
        pcVar5 = pcVar2;
        if (cVar4 == '\0') {
          bVar6 = *pcVar3 == '\0';
        }
        while( true ) {
          pcVar2 = pcVar5 + 1;
          if (cVar4 == '\0') {
            return bVar6;
          }
          if (cVar4 == ':') break;
          bVar6 = (bool)(bVar6 & cVar4 == *pcVar3);
          cVar4 = pcVar5[2];
          pcVar3 = pcVar3 + 1;
          pcVar5 = pcVar2;
        }
      } while ((!bVar6) || (_Var1 = true, *pcVar3 != '\0'));
    }
  }
  return _Var1;
}

Assistant:

bool rtosc_match(const char *pattern,
                 const char *msg, const char** path_end)
{
    const char *arg_pattern = rtosc_match_path(pattern, msg, path_end);
    if(!arg_pattern)
        return false;
    else if(*arg_pattern == ':')
        return rtosc_match_args(arg_pattern, msg);
    return true;
}